

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptors_haar_unroll_1_2_True
               (integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  pointer piVar1;
  ulong uVar2;
  long lVar3;
  
  piVar1 = (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl
      .super__Vector_impl_data._M_finish != piVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      get_msurf_descriptor_haar_unroll_1_2_True
                (iimage,(interest_point *)((long)piVar1->descriptor + lVar3 + -0x14));
      piVar1 = (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x114;
    } while (uVar2 < (ulong)(((long)(interest_points->
                                    super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2)
                            * -0xed7303b5cc0ed73));
  }
  return;
}

Assistant:

void get_msurf_descriptors_haar_unroll_1_2_True(struct integral_image* iimage, std::vector<struct interest_point> *interest_points) {
    for (size_t i=0; i<interest_points->size(); ++i) {
        get_msurf_descriptor_haar_unroll_1_2_True(iimage, &interest_points->at(i));
    }
}